

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,external_fixup *xfx)

{
  ostream *poVar1;
  binding local_1c;
  external_fixup *local_18;
  external_fixup *xfx_local;
  ostream *os_local;
  
  local_18 = xfx;
  xfx_local = (external_fixup *)os;
  poVar1 = std::operator<<(os,"{ name:");
  poVar1 = pstore::operator<<(poVar1,&local_18->name);
  poVar1 = std::operator<<(poVar1,", type:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)local_18->type);
  poVar1 = std::operator<<(poVar1,", binding:");
  local_1c = external_fixup::strength(local_18);
  poVar1 = operator<<(poVar1,&local_1c);
  poVar1 = std::operator<<(poVar1,", offset:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->offset);
  poVar1 = std::operator<<(poVar1,", addend:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->addend);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, external_fixup const & xfx) {
            return os << "{ name:" << xfx.name << ", type:" << static_cast<unsigned> (xfx.type)
                      << ", binding:" << xfx.strength () << ", offset:" << xfx.offset
                      << ", addend:" << xfx.addend << '}';
        }